

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

DPJoinNode * __thiscall
duckdb::PlanEnumerator::EmitPair
          (PlanEnumerator *this,JoinRelationSet *left,JoinRelationSet *right,
          vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *info)

{
  reference_map_t<JoinRelationSet,_unique_ptr<DPJoinNode>_> *this_00;
  double dVar1;
  unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> __p;
  iterator iVar2;
  iterator iVar3;
  JoinRelationSet *possible_connections;
  type pDVar4;
  pointer pDVar5;
  __uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_> *this_01;
  mapped_type *this_02;
  InternalException *this_03;
  key_type local_58;
  unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> new_plan;
  
  this_00 = &this->plans;
  new_plan.super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
  super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)
       (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)left;
  iVar2 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&new_plan);
  new_plan.super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
  super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)
       (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)right;
  iVar3 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&new_plan);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
       ._M_cur == (__node_type *)0x0) ||
     (iVar3.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0)) {
    this_03 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_plan,"No left or right plan: internal error in join order optimizer",
               (allocator *)&local_58);
    InternalException::InternalException(this_03,(string *)&new_plan);
    __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  possible_connections =
       JoinRelationSetManager::Union(&this->query_graph_manager->set_manager,left,right);
  pDVar4 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
                     ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                       *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
                                ._M_cur + 0x10));
  unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
            ((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
                    ._M_cur + 0x10));
  CreateJoinTree((PlanEnumerator *)&new_plan,(JoinRelationSet *)this,
                 (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *)possible_connections,
                 (DPJoinNode *)info,pDVar4);
  local_58._M_data = possible_connections;
  iVar2 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_58);
  pDVar5 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
                     (&new_plan);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    dVar1 = pDVar5->cost;
    pDVar5 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
             operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                         *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
                                  ._M_cur + 0x10));
    if (pDVar5->cost <= dVar1) {
      pDVar4 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
               operator*((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                          *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
                                   ._M_cur + 0x10));
      goto LAB_0122046a;
    }
  }
  local_58._M_data = possible_connections;
  this_01 = (__uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_> *)
            ::std::__detail::
            _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,&local_58);
  __p = new_plan;
  new_plan.super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
  super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)
       (__uniq_ptr_data<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true,_true>)0x0
  ;
  ::std::__uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>::reset
            (this_01,(pointer)__p.
                              super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>
                              .super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl);
  local_58._M_data = possible_connections;
  this_02 = ::std::__detail::
            _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,&local_58);
  pDVar4 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator*
                     (this_02);
LAB_0122046a:
  ::std::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>::~unique_ptr
            (&new_plan.
              super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>);
  return pDVar4;
}

Assistant:

DPJoinNode &PlanEnumerator::EmitPair(JoinRelationSet &left, JoinRelationSet &right,
                                     const vector<reference<NeighborInfo>> &info) {
	// get the left and right join plans
	auto left_plan = plans.find(left);
	auto right_plan = plans.find(right);
	if (left_plan == plans.end() || right_plan == plans.end()) {
		throw InternalException("No left or right plan: internal error in join order optimizer");
	}
	auto &new_set = query_graph_manager.set_manager.Union(left, right);
	// create the join tree based on combining the two plans
	auto new_plan = CreateJoinTree(new_set, info, *left_plan->second, *right_plan->second);
	// check if this plan is the optimal plan we found for this set of relations
	auto entry = plans.find(new_set);
	auto new_cost = new_plan->cost;
	double old_cost = NumericLimits<double>::Maximum();
	if (entry != plans.end()) {
		old_cost = entry->second->cost;
	}
	if (entry == plans.end() || new_cost < old_cost) {
		// the new plan costs less than the old plan. Update our DP table.
		plans[new_set] = std::move(new_plan);
		return *plans[new_set];
	}
	// Create join node from the plan currently in the DP table.
	return *entry->second;
}